

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Federate.cpp
# Opt level: O3

void __thiscall helics::Federate::Federate(Federate *this)

{
  this->_vptr_Federate = (_func_int **)&PTR__Federate_004b9e38;
  this->currentMode = STARTUP;
  this->nameSegmentSeparator = '/';
  this->strictConfigChecking = true;
  this->hasPotentialInterfaces = false;
  this->useJsonSerialization = false;
  this->observerMode = false;
  this->retriggerTimeRequest = false;
  this->singleThreadFederate = false;
  (this->fedID).fid = -2000000000;
  (this->coreObject).super___shared_ptr<helics::Core,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->coreObject).super___shared_ptr<helics::Core,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->mCurrentTime).internalTimeCode = -0x7fffffffffffffff;
  (this->mStopTime).internalTimeCode = 0x7fffffffffffffff;
  (this->configFile)._M_dataplus._M_p = (pointer)&(this->configFile).field_2;
  (this->configFile)._M_string_length = 0;
  (this->configFile).field_2._M_local_buf[0] = '\0';
  (this->asyncCallInfo)._M_t.
  super___uniq_ptr_impl<gmlc::libguarded::shared_guarded<helics::AsyncFedCallInfo,_std::mutex>,_std::default_delete<gmlc::libguarded::shared_guarded<helics::AsyncFedCallInfo,_std::mutex>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_gmlc::libguarded::shared_guarded<helics::AsyncFedCallInfo,_std::mutex>_*,_std::default_delete<gmlc::libguarded::shared_guarded<helics::AsyncFedCallInfo,_std::mutex>_>_>
  .
  super__Head_base<0UL,_gmlc::libguarded::shared_guarded<helics::AsyncFedCallInfo,_std::mutex>_*,_false>
  ._M_head_impl = (shared_guarded<helics::AsyncFedCallInfo,_std::mutex> *)0x0;
  (this->cManager)._M_t.
  super___uniq_ptr_impl<helics::ConnectorFederateManager,_std::default_delete<helics::ConnectorFederateManager>_>
  ._M_t.
  super__Tuple_impl<0UL,_helics::ConnectorFederateManager_*,_std::default_delete<helics::ConnectorFederateManager>_>
  .super__Head_base<0UL,_helics::ConnectorFederateManager_*,_false>._M_head_impl =
       (ConnectorFederateManager *)0x0;
  *(undefined8 *)
   ((long)&(this->cManager)._M_t.
           super___uniq_ptr_impl<helics::ConnectorFederateManager,_std::default_delete<helics::ConnectorFederateManager>_>
           ._M_t.
           super__Tuple_impl<0UL,_helics::ConnectorFederateManager_*,_std::default_delete<helics::ConnectorFederateManager>_>
           .super__Head_base<0UL,_helics::ConnectorFederateManager_*,_false>._M_head_impl + 4) = 0;
  *(undefined8 *)
   ((long)&(this->potManager)._M_t.
           super___uniq_ptr_impl<helics::PotentialInterfacesManager,_std::default_delete<helics::PotentialInterfacesManager>_>
           ._M_t.
           super__Tuple_impl<0UL,_helics::PotentialInterfacesManager_*,_std::default_delete<helics::PotentialInterfacesManager>_>
           .super__Head_base<0UL,_helics::PotentialInterfacesManager_*,_false>._M_head_impl + 4) = 0
  ;
  (this->mName)._M_dataplus._M_p = (pointer)&(this->mName).field_2;
  (this->mName)._M_string_length = 0;
  (this->mName).field_2._M_local_buf[0] = '\0';
  memset(&this->timeRequestEntryCallback,0,0x100);
  return;
}

Assistant:

Federate::Federate() noexcept
{
    // this function needs to be defined for the virtual inheritance to compile but shouldn't
    // actually be executed
}